

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt.cpp
# Opt level: O2

void rt_copy1col_c(int hx,int sx,int yl,int yh)

{
  int iVar1;
  BYTE *pBVar2;
  uint uVar3;
  BYTE *pBVar4;
  long lVar5;
  
  iVar1 = dc_pitch;
  uVar3 = yh - yl;
  if (-1 < (int)uVar3) {
    pBVar2 = dc_destorg + (long)sx + (long)ylookup[yl];
    pBVar4 = dc_temp + (hx + yl * 4);
    lVar5 = (long)dc_pitch;
    if ((uVar3 & 1) == 0) {
      *pBVar2 = *pBVar4;
      pBVar4 = pBVar4 + 4;
      pBVar2 = pBVar2 + lVar5;
    }
    if ((uVar3 + 1 & 2) != 0) {
      *pBVar2 = *pBVar4;
      pBVar2[lVar5] = pBVar4[4];
      pBVar4 = pBVar4 + 8;
      pBVar2 = pBVar2 + lVar5 * 2;
    }
    if (2 < uVar3) {
      uVar3 = uVar3 + 1 >> 2;
      do {
        *pBVar2 = *pBVar4;
        pBVar2[lVar5] = pBVar4[4];
        pBVar2[lVar5 * 2] = pBVar4[8];
        pBVar2[lVar5 * 3] = pBVar4[0xc];
        pBVar4 = pBVar4 + 0x10;
        pBVar2 = pBVar2 + iVar1 * 4;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
    }
  }
  return;
}

Assistant:

void rt_copy1col_c (int hx, int sx, int yl, int yh)
{
	BYTE *source;
	BYTE *dest;
	int count;
	int pitch;

	count = yh-yl;
	if (count < 0)
		return;
	count++;

	dest = ylookup[yl] + sx + dc_destorg;
	source = &dc_temp[yl*4 + hx];
	pitch = dc_pitch;

	if (count & 1) {
		*dest = *source;
		source += 4;
		dest += pitch;
	}
	if (count & 2) {
		dest[0] = source[0];
		dest[pitch] = source[4];
		source += 8;
		dest += pitch*2;
	}
	if (!(count >>= 2))
		return;

	do {
		dest[0] = source[0];
		dest[pitch] = source[4];
		dest[pitch*2] = source[8];
		dest[pitch*3] = source[12];
		source += 16;
		dest += pitch*4;
	} while (--count);
}